

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RS232Port.h
# Opt level: O0

int CloseRS232Port(RS232PORT *pRS232Port)

{
  RS232PORT *pRS232Port_local;
  
  switch(pRS232Port->DevType) {
  case 0:
    pRS232Port_local._4_4_ = CloseComputerRS232Port(pRS232Port->hDev);
    break;
  case 1:
    pRS232Port_local._4_4_ = releasetcpcli(pRS232Port->s);
    break;
  case 2:
    disconnectclifromtcpsrv(pRS232Port->s);
    pRS232Port_local._4_4_ = releasetcpsrv(pRS232Port->s_srv);
    break;
  case 3:
    pRS232Port_local._4_4_ = releaseudpcli(pRS232Port->s);
    break;
  case 4:
    disconnectclifromudpsrv(pRS232Port->s);
    pRS232Port_local._4_4_ = releaseudpsrv(pRS232Port->s_srv);
    break;
  default:
    pRS232Port_local._4_4_ = 1;
  }
  return pRS232Port_local._4_4_;
}

Assistant:

inline int CloseRS232Port(RS232PORT* pRS232Port)
{
	switch (pRS232Port->DevType)
	{
	case TCP_CLIENT_TYPE_RS232PORT:
		return releasetcpcli(pRS232Port->s);
	case TCP_SERVER_TYPE_RS232PORT:
		if (disconnectclifromtcpsrv(pRS232Port->s) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_WARNING_RS232PORT(("CloseRS232Port error (%s) : %s(pRS232Port=%#x)\n", 
				strtime_m(), 
				"Error disconnecting a client. ", 
				pRS232Port));
		}
		return releasetcpsrv(pRS232Port->s_srv);
	case UDP_CLIENT_TYPE_RS232PORT:
		return releaseudpcli(pRS232Port->s);
	case UDP_SERVER_TYPE_RS232PORT:
		if (disconnectclifromudpsrv(pRS232Port->s) != EXIT_SUCCESS)
		{
			PRINT_DEBUG_WARNING_RS232PORT(("CloseRS232Port error (%s) : %s(pRS232Port=%#x)\n", 
				strtime_m(), 
				"Error disconnecting a client. ", 
				pRS232Port));
		}
		return releaseudpsrv(pRS232Port->s_srv);
	case LOCAL_TYPE_RS232PORT:
		return CloseComputerRS232Port(pRS232Port->hDev);
	default:
		PRINT_DEBUG_ERROR_RS232PORT(("CloseRS232Port error (%s) : %s(pRS232Port=%#x)\n", 
			strtime_m(), 
			"Invalid device type. ", 
			pRS232Port));
		return EXIT_FAILURE;
	}
}